

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

bool __thiscall
MutableS2ShapeIndex::Init(MutableS2ShapeIndex *this,Decoder *decoder,ShapeFactory *shape_factory)

{
  uint uVar1;
  bool bVar2;
  uint num_shape_ids;
  pointer pSVar3;
  ulong uVar4;
  size_t sVar5;
  S2ShapeIndexCell *this_00;
  iterator iVar6;
  iterator position;
  pair<S2CellId,_S2ShapeIndexCell_*> local_100;
  pair<const_S2CellId,_S2ShapeIndexCell_*> local_f0;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *local_e0;
  int local_d8;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *local_d0;
  int local_c8;
  undefined1 local_c0 [8];
  Decoder decoder_1;
  S2ShapeIndexCell *cell;
  S2CellId id;
  int i;
  EncodedStringVector encoded_cells;
  EncodedS2CellIdVector cell_ids;
  unique_ptr<S2Shape,_std::default_delete<S2Shape>_> local_48;
  unique_ptr<S2Shape,_std::default_delete<S2Shape>_> shape;
  int shape_id;
  uint32 num_shapes;
  int version;
  uint64 max_edges_version;
  ShapeFactory *shape_factory_local;
  Decoder *decoder_local;
  MutableS2ShapeIndex *this_local;
  
  max_edges_version = (uint64)shape_factory;
  shape_factory_local = (ShapeFactory *)decoder;
  decoder_local = (Decoder *)this;
  Clear(this);
  bVar2 = Decoder::get_varint64((Decoder *)shape_factory_local,(uint64 *)&num_shapes);
  if (bVar2) {
    if ((_num_shapes & 3) == 0) {
      Options::set_max_edges_per_cell(&this->options_,(int)(_num_shapes >> 2));
      num_shape_ids = (**(code **)(*(long *)max_edges_version + 0x10))();
      std::
      vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
      ::reserve(&this->shapes_,(ulong)num_shape_ids);
      for (shape._M_t.super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>._M_t.
           super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
           super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl._4_4_ = 0;
          shape._M_t.super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>._M_t.
          super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
          super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl._4_4_ < num_shape_ids;
          shape._M_t.super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>._M_t.
          super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
          super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl._4_4_ =
               shape._M_t.super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>._M_t.
               super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
               super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl._4_4_ + 1) {
        (**(code **)(*(long *)max_edges_version + 0x18))
                  (&local_48,max_edges_version,
                   shape._M_t.super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>._M_t.
                   super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                   super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl._4_4_);
        bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_48);
        uVar1 = shape._M_t.super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>._M_t.
                super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl._4_4_;
        if (bVar2) {
          pSVar3 = std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>::operator->(&local_48);
          pSVar3->id_ = uVar1;
        }
        std::
        vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
        ::push_back(&this->shapes_,&local_48);
        std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>::~unique_ptr(&local_48);
      }
      s2coding::EncodedS2CellIdVector::EncodedS2CellIdVector
                ((EncodedS2CellIdVector *)&encoded_cells.data_);
      s2coding::EncodedStringVector::EncodedStringVector((EncodedStringVector *)((long)&id.id_ + 4))
      ;
      bVar2 = s2coding::EncodedS2CellIdVector::Init
                        ((EncodedS2CellIdVector *)&encoded_cells.data_,
                         (Decoder *)shape_factory_local);
      if (bVar2) {
        bVar2 = s2coding::EncodedStringVector::Init
                          ((EncodedStringVector *)((long)&id.id_ + 4),(Decoder *)shape_factory_local
                          );
        if (bVar2) {
          for (id.id_._0_4_ = 0; uVar4 = (ulong)(int)id.id_,
              sVar5 = s2coding::EncodedS2CellIdVector::size
                                ((EncodedS2CellIdVector *)&encoded_cells.data_), uVar4 < sVar5;
              id.id_._0_4_ = (int)id.id_ + 1) {
            register0x00000000 =
                 s2coding::EncodedS2CellIdVector::operator[]
                           ((EncodedS2CellIdVector *)&encoded_cells.data_,(int)id.id_);
            this_00 = (S2ShapeIndexCell *)operator_new(0x10);
            S2ShapeIndexCell::S2ShapeIndexCell(this_00);
            decoder_1.limit_ = (uchar *)this_00;
            s2coding::EncodedStringVector::GetDecoder
                      ((Decoder *)local_c0,(EncodedStringVector *)((long)&id.id_ + 4),(int)id.id_);
            bVar2 = S2ShapeIndexCell::Decode
                              ((S2ShapeIndexCell *)decoder_1.limit_,num_shape_ids,
                               (Decoder *)local_c0);
            if (!bVar2) {
              return false;
            }
            iVar6 = gtl::internal_btree::
                    btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
                    ::end((btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
                           *)&this->cell_map_);
            local_e0 = iVar6.node;
            local_d8 = iVar6.position;
            local_d0 = local_e0;
            local_c8 = local_d8;
            local_100 = std::make_pair<S2CellId&,S2ShapeIndexCell*&>
                                  ((S2CellId *)((long)&cell + 4),
                                   (S2ShapeIndexCell **)&decoder_1.limit_);
            std::pair<const_S2CellId,_S2ShapeIndexCell_*>::pair<S2CellId,_S2ShapeIndexCell_*,_true>
                      (&local_f0,&local_100);
            position.position = local_c8;
            position.node = local_d0;
            position._12_4_ = 0;
            gtl::internal_btree::
            btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
            ::insert((btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
                      *)&this->cell_map_,position,&local_f0);
          }
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MutableS2ShapeIndex::Init(Decoder* decoder,
                               const ShapeFactory& shape_factory) {
  Clear();
  uint64 max_edges_version;
  if (!decoder->get_varint64(&max_edges_version)) return false;
  int version = max_edges_version & 3;
  if (version != kCurrentEncodingVersionNumber) return false;
  options_.set_max_edges_per_cell(max_edges_version >> 2);
  uint32 num_shapes = shape_factory.size();
  shapes_.reserve(num_shapes);
  for (int shape_id = 0; shape_id < num_shapes; ++shape_id) {
    auto shape = shape_factory[shape_id];
    if (shape) shape->id_ = shape_id;
    shapes_.push_back(std::move(shape));
  }

  s2coding::EncodedS2CellIdVector cell_ids;
  s2coding::EncodedStringVector encoded_cells;
  if (!cell_ids.Init(decoder)) return false;
  if (!encoded_cells.Init(decoder)) return false;

  for (int i = 0; i < cell_ids.size(); ++i) {
    S2CellId id = cell_ids[i];
    S2ShapeIndexCell* cell = new S2ShapeIndexCell;
    Decoder decoder = encoded_cells.GetDecoder(i);
    if (!cell->Decode(num_shapes, &decoder)) return false;
    cell_map_.insert(cell_map_.end(), std::make_pair(id, cell));
  }
  return true;
}